

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_parser<wchar_t,_std::allocator<char>_>::after_value
          (basic_json_parser<wchar_t,_std::allocator<char>_> *this,error_code *ec)

{
  parse_state pVar1;
  bool bVar2;
  function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *in_RSI;
  ser_context *in_RDI;
  undefined4 in_stack_ffffffffffffffec;
  json_errc __args;
  
  pVar1 = parent(this);
  __args = CONCAT13(pVar1,(int3)in_stack_ffffffffffffffec);
  if (pVar1 == root) {
    *(undefined1 *)&in_RDI[0xf]._vptr_ser_context = 2;
  }
  else if ((pVar1 == object) || (pVar1 == array)) {
    *(undefined1 *)&in_RDI[0xf]._vptr_ser_context = 7;
  }
  else {
    bVar2 = std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::operator()
                      (in_RSI,__args,in_RDI);
    *(bool *)((long)&in_RDI[0xf]._vptr_ser_context + 3) = bVar2;
    if (((ulong)in_RDI[0xf]._vptr_ser_context & 0x1000000) == 0) {
      std::error_code::operator=((error_code *)in_RSI,__args);
    }
  }
  return;
}

Assistant:

void after_value(std::error_code& ec) 
    {
        switch (parent())
        {
            case parse_state::array:
            case parse_state::object:
                state_ = parse_state::expect_comma_or_end;
                break;
            case parse_state::root:
                state_ = parse_state::accept;
                break;
            default:
                more_ = err_handler_(json_errc::syntax_error, *this);
                if (!more_)
                {
                    ec = json_errc::syntax_error;
                    return;
                }
                break;
        }
    }